

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_cursor.hpp
# Opt level: O0

void __thiscall
jsoncons::cbor::basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
reset(basic_cbor_cursor<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
     error_code *ec)

{
  ulong uVar1;
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *in_RSI;
  long *in_RDI;
  basic_staj_visitor<char> *in_stack_00000030;
  
  basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::reset(in_RSI);
  basic_staj_visitor<char>::reset(in_stack_00000030);
  basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::reset
            ((basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *)in_RSI);
  *(undefined1 *)(in_RDI + 0x76) = 0;
  uVar1 = (**(code **)(*in_RDI + 0x18))();
  if ((uVar1 & 1) == 0) {
    (**(code **)(*in_RDI + 0x40))(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void reset(std::error_code& ec)
    {
        parser_.reset();
        cursor_visitor_.reset();
        cursor_handler_adaptor_.reset();
        eof_ = false;
        if (!done())
        {
            next(ec);
        }
    }